

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_generator.cc
# Opt level: O2

void grpc_go_generator::anon_unknown_0::GenerateServerMethodSignature
               (Method *method,Printer *printer,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *vars)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  key_type local_c8;
  string local_a8;
  key_type local_88;
  key_type local_68;
  string local_48;
  
  (*(method->super_CommentHolder)._vptr_CommentHolder[5])(&local_48,method);
  exportName(&local_a8,&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"Method",(allocator<char> *)&local_88);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  (*(method->super_CommentHolder)._vptr_CommentHolder[0xb])(&local_a8,method);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"Request",(allocator<char> *)&local_88);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"CustomMethodIO",&local_c9)
  ;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_c8);
  bVar1 = std::operator==(pmVar3,"");
  if (bVar1) {
    (*(method->super_CommentHolder)._vptr_CommentHolder[0xd])(&local_a8,method);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"CustomMethodIO",&local_ca);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_88);
    std::__cxx11::string::string((string *)&local_a8,(string *)pmVar3);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Response",&local_cb);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_68);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_a8);
  if (!bVar1) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  iVar2 = (*(method->super_CommentHolder)._vptr_CommentHolder[0xf])(method);
  if ((char)iVar2 == '\0') {
    bVar1 = ServerOnlyStreaming(method);
    if (bVar1) {
      pcVar4 = "$Method$(*$Request$, $Service$_$Method$Server) error$Ending$";
    }
    else {
      pcVar4 = "$Method$($Service$_$Method$Server) error$Ending$";
    }
    (*printer->_vptr_Printer[2])(printer,vars,pcVar4);
  }
  else {
    (*printer->_vptr_Printer[2])
              (printer,vars,"$Method$($context$.Context, *$Request$) (*$Response$, error)$Ending$");
  }
  return;
}

Assistant:

static void GenerateServerMethodSignature(const grpc_generator::Method *method,
                                   grpc_generator::Printer *printer,
                                   std::map<grpc::string, grpc::string> vars) {
  vars["Method"] = exportName(method->name());
  vars["Request"] = method->get_input_type_name();
  vars["Response"] = (vars["CustomMethodIO"] == "")
                         ? method->get_output_type_name()
                         : vars["CustomMethodIO"];
  if (method->NoStreaming()) {
    printer->Print(
        vars,
        "$Method$($context$.Context, *$Request$) (*$Response$, error)$Ending$");
  } else if (ServerOnlyStreaming(method)) {
    printer->Print(
        vars, "$Method$(*$Request$, $Service$_$Method$Server) error$Ending$");
  } else {
    printer->Print(vars, "$Method$($Service$_$Method$Server) error$Ending$");
  }
}